

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  cpp_dec_float<200U,_int,_void> *this_00;
  cpp_dec_float<200U,_int,_void> *this_01;
  bool bVar1;
  int32_t iVar2;
  pointer pnVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  fpclass_type fVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  Real a;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_1d4;
  cpp_dec_float<200U,_int,_void> local_1a8;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar17 = 0;
  uVar6 = (uint)((ulong)((long)(x->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(x->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 7);
  if (uVar6 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    (x->super_IdxSet).num = 0;
  }
  else {
    if ((int)uVar6 < 1) {
      local_1d4 = 0;
    }
    else {
      uVar15 = 0;
      this_01 = &local_1a8;
      local_1d4 = 0;
      do {
        pnVar3 = (x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = &pnVar3[uVar15].m_backend;
        fVar10 = cpp_dec_float_NaN;
        if (pnVar3[uVar15].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0051c22c:
          pcVar11 = this_00;
          puVar12 = local_a0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar12 = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
            puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
          }
          iVar7 = this_00->exp;
          bVar1 = this_00->neg;
          iVar2 = this_00->prec_elem;
          a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
          puVar12 = local_a0;
          pcVar11 = &local_120;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar12;
            puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          local_120.neg = bVar1;
          if ((bVar1 == true) && (local_120.data._M_elems[0] != 0 || fVar10 != cpp_dec_float_finite)
             ) {
            local_120.neg = false;
          }
          local_120.exp = iVar7;
          local_120.fpclass = fVar10;
          local_120.prec_elem = iVar2;
          if ((fVar10 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_1a8.fpclass = cpp_dec_float_finite;
            local_1a8.prec_elem = 0x1c;
            local_1a8.data._M_elems[0] = 0;
            local_1a8.data._M_elems[1] = 0;
            local_1a8.data._M_elems[2] = 0;
            local_1a8.data._M_elems[3] = 0;
            local_1a8.data._M_elems[4] = 0;
            local_1a8.data._M_elems[5] = 0;
            local_1a8.data._M_elems[6] = 0;
            local_1a8.data._M_elems[7] = 0;
            local_1a8.data._M_elems[8] = 0;
            local_1a8.data._M_elems[9] = 0;
            local_1a8.data._M_elems[10] = 0;
            local_1a8.data._M_elems[0xb] = 0;
            local_1a8.data._M_elems[0xc] = 0;
            local_1a8.data._M_elems[0xd] = 0;
            local_1a8.data._M_elems[0xe] = 0;
            local_1a8.data._M_elems[0xf] = 0;
            local_1a8.data._M_elems[0x10] = 0;
            local_1a8.data._M_elems[0x11] = 0;
            local_1a8.data._M_elems[0x12] = 0;
            local_1a8.data._M_elems[0x13] = 0;
            local_1a8.data._M_elems[0x14] = 0;
            local_1a8.data._M_elems[0x15] = 0;
            local_1a8.data._M_elems[0x16] = 0;
            local_1a8.data._M_elems[0x17] = 0;
            local_1a8.data._M_elems[0x18] = 0;
            local_1a8.data._M_elems[0x19] = 0;
            local_1a8.data._M_elems._104_5_ = 0;
            local_1a8.data._M_elems[0x1b]._1_3_ = 0;
            local_1a8.exp = 0;
            local_1a8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)this_01,a);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_120,this_01);
            if (0 < iVar7) {
              pIVar4 = (A->set).theitem;
              iVar7 = (A->set).thekey[uVar15].idx;
              lVar8 = (long)local_1d4;
              local_1d4 = local_1d4 + 1;
              (x->super_IdxSet).idx[lVar8] = (int)uVar15;
              lVar8 = (long)pIVar4[iVar7].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
              if (0 < lVar8) {
                uVar16 = lVar8 + 1;
                lVar8 = lVar8 * 0x84;
                do {
                  pNVar5 = pIVar4[iVar7].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem;
                  pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)&pNVar5[-1].val.m_backend.data + lVar8);
                  local_1a8.fpclass = cpp_dec_float_finite;
                  local_1a8.prec_elem = 0x1c;
                  local_1a8.data._M_elems[0x18] = 0;
                  local_1a8.data._M_elems[0x19] = 0;
                  local_1a8.data._M_elems._104_5_ = 0;
                  local_1a8.data._M_elems[0x14] = 0;
                  local_1a8.data._M_elems[0x15] = 0;
                  local_1a8.data._M_elems[0x16] = 0;
                  local_1a8.data._M_elems[0x17] = 0;
                  local_1a8.data._M_elems[0x10] = 0;
                  local_1a8.data._M_elems[0x11] = 0;
                  local_1a8.data._M_elems[0x12] = 0;
                  local_1a8.data._M_elems[0x13] = 0;
                  local_1a8.data._M_elems[0xc] = 0;
                  local_1a8.data._M_elems[0xd] = 0;
                  local_1a8.data._M_elems[0xe] = 0;
                  local_1a8.data._M_elems[0xf] = 0;
                  local_1a8.data._M_elems[8] = 0;
                  local_1a8.data._M_elems[9] = 0;
                  local_1a8.data._M_elems[10] = 0;
                  local_1a8.data._M_elems[0xb] = 0;
                  local_1a8.data._M_elems[4] = 0;
                  local_1a8.data._M_elems[5] = 0;
                  local_1a8.data._M_elems[6] = 0;
                  local_1a8.data._M_elems[7] = 0;
                  local_1a8.data._M_elems[0] = 0;
                  local_1a8.data._M_elems[1] = 0;
                  local_1a8.data._M_elems[2] = 0;
                  local_1a8.data._M_elems[3] = 0;
                  local_1a8.data._M_elems[0x1b]._1_3_ = 0;
                  local_1a8.exp = 0;
                  local_1a8.neg = false;
                  pcVar13 = pcVar11;
                  if (pcVar11 == this_01) {
                    pcVar13 = this_00;
                  }
                  if (pcVar11 != this_01 && this_01 != this_00) {
                    pcVar13 = this_00;
                    pcVar14 = this_01;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pcVar14->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                      pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar13 + (ulong)bVar17 * -8 + 4);
                      pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar14 + (ulong)bVar17 * -8 + 4);
                    }
                    local_1a8.exp = this_00->exp;
                    local_1a8.neg = this_00->neg;
                    local_1a8.fpclass = this_00->fpclass;
                    local_1a8.prec_elem = this_00->prec_elem;
                    pcVar13 = pcVar11;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                            (this_01,pcVar13);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)*(int *)((long)(&pNVar5[-1].val + 1) + lVar8) * 0x80 +
                             *(long *)(this + 0x20)),this_01);
                  uVar16 = uVar16 - 1;
                  lVar8 = lVar8 + -0x84;
                } while (1 < uVar16);
              }
              goto LAB_0051c485;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (this_01,0,(type *)0x0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (this_00,this_01);
          if (iVar7 != 0) {
            fVar10 = this_00->fpclass;
            goto LAB_0051c22c;
          }
        }
LAB_0051c485:
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uVar6 & 0x7fffffff));
    }
    (x->super_IdxSet).num = local_1d4;
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
  }
  x->setupStatus = true;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productAndSetup(const SVSetBase<S>& A, SSVectorBase<T>& x)
{
   assert(!x.isSetup());

   if(x.dim() == 0)
   {
      // x == 0 => this := zero vector
      clear();
      x.num = 0;
   }
   else
   {
      // x is not setup, so walk through its value vector
      int nzcount = 0;
      int end = x.dim();

      for(int i = 0; i < end; ++i)
      {
         // advance to the next element != 0
         T& xval = x.val[i];

         if(xval != 0)
         {
            // If x[i] is really nonzero, compute A[i] * x[i] and adapt x.idx,
            // otherwise set x[i] to 0.
            if(isNotZero(xval, this->tolerances()->epsilon()))
            {
               const SVectorBase<S>& Ai = A[i];
               x.idx[ nzcount++ ] = i;

               for(int j = Ai.size() - 1; j >= 0; --j)
               {
                  const Nonzero<S>& elt = Ai.element(j);
                  VectorBase<R>::val[elt.idx] += xval * elt.val;
               }
            }
            else
               xval = 0;
         }
      }

      x.num = nzcount;
      setupStatus = false;
   }

   x.setupStatus = true;

   assert(isConsistent());

   return *this;
}